

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

EscapeSequence duckdb::Terminal::ReadEscapeSequence(int ifd)

{
  byte bVar1;
  int iVar2;
  idx_t iVar3;
  char *pcVar4;
  allocator local_36;
  char seq [5];
  string local_30 [32];
  
  iVar3 = ReadEscapeSequence(ifd,seq);
  if (iVar3 == 0) {
    return INVALID;
  }
  ::std::__cxx11::string::string(local_30,"escape of length %d\n",&local_36);
  ::std::__cxx11::string::~string(local_30);
  switch(iVar3) {
  case 1:
    if ((byte)(seq[0] + 0x9fU) < 0x1a) {
      return (byte)seq[0] - 0x54;
    }
    if ((byte)(seq[0] + 0xbfU) < 0x1a) {
      return (byte)seq[0] - (ALT_T|ALT_H);
    }
    if (seq[0] == '\x7f') {
      return ALT_BACKSPACE;
    }
    if (seq[0] == '<') {
      return ALT_LEFT_ARROW;
    }
    if (seq[0] == '>') {
      return ALT_RIGHT_ARROW;
    }
    if (seq[0] == '\\') {
      return ALT_BACKSLASH;
    }
    if ((byte)seq[0] == 0x1b) {
      return ESCAPE;
    }
    pcVar4 = "unrecognized escape sequence of length 1 - %d\n";
    break;
  case 2:
    if (seq[0] == '[') {
      switch(seq[1]) {
      case 'A':
LAB_001f388b:
        return UP;
      case 'B':
LAB_001f388b:
        return DOWN;
      case 'C':
LAB_001f388b:
        return RIGHT;
      case 'D':
LAB_001f388b:
        return LEFT;
      case 'F':
LAB_001f388b:
        return END;
      case 'H':
LAB_001f388b:
        return HOME;
      default:
        if (seq[1] == 'Z') {
          return SHIFT_TAB;
        }
      case 'E':
      case 'G':
        pcVar4 = "unrecognized escape sequence (seq[1]) %d\n";
      }
    }
    else if (seq[0] == 'O') {
      switch(seq[1]) {
      case 'A':
        goto LAB_001f388b;
      case 'B':
        goto LAB_001f388b;
      case 'C':
        goto LAB_001f388b;
      case 'D':
        goto LAB_001f388b;
      case 'F':
        goto LAB_001f388b;
      case 'H':
        goto LAB_001f388b;
      default:
        if (seq[1] == 'c') {
          return ALT_F;
        }
        if (seq[1] == 'd') {
          return ALT_B;
        }
      case 'E':
      case 'G':
        pcVar4 = "unrecognized escape sequence (O) %d\n";
      }
    }
    else {
      pcVar4 = "unrecognized escape sequence of length %d (%d %d)\n";
    }
    break;
  case 3:
    if (seq[2] == '~') {
      bVar1 = seq[1] - 0x31;
      if ((bVar1 < 8) && ((0x8dU >> (bVar1 & 0x1f) & 1) != 0)) {
        return *(EscapeSequence *)(&DAT_00f8af98 + (ulong)bVar1 * 4);
      }
      pcVar4 = "unrecognized escape sequence (~) %d\n";
      break;
    }
    if (seq[2] == 'C' && (byte)(seq[1] ^ 0x35U) == 0) {
      return ALT_F;
    }
    if (seq[2] == 'D' && (byte)(seq[1] ^ 0x35U) == 0) {
      return ALT_B;
    }
  default:
    pcVar4 = "unrecognized escape sequence of length %d\n";
    break;
  case 5:
    iVar2 = bcmp(seq,"[1;5C",5);
    if (iVar2 == 0) {
      return CTRL_MOVE_FORWARDS;
    }
    iVar2 = bcmp(seq,"[1;3C",5);
    if (iVar2 == 0) {
      return CTRL_MOVE_FORWARDS;
    }
    iVar2 = bcmp(seq,"[1;5D",5);
    if (iVar2 == 0) {
      return CTRL_MOVE_BACKWARDS;
    }
    iVar2 = bcmp(seq,"[1;3D",5);
    if (iVar2 == 0) {
      return CTRL_MOVE_BACKWARDS;
    }
    pcVar4 = "unrecognized escape sequence (;) %d\n";
  }
  ::std::__cxx11::string::string(local_30,pcVar4,&local_36);
  ::std::__cxx11::string::~string(local_30);
  return UNKNOWN;
}

Assistant:

EscapeSequence Terminal::ReadEscapeSequence(int ifd) {
	char seq[5];
	idx_t length = ReadEscapeSequence(ifd, seq);
	if (length == 0) {
		return EscapeSequence::INVALID;
	}
	Linenoise::Log("escape of length %d\n", length);
	switch (length) {
	case 1:
		if (seq[0] >= 'a' && seq[0] <= 'z') {
			return EscapeSequence(idx_t(EscapeSequence::ALT_A) + (seq[0] - 'a'));
		}
		if (seq[0] >= 'A' && seq[0] <= 'Z') {
			return EscapeSequence(idx_t(EscapeSequence::ALT_A) + (seq[0] - 'A'));
		}
		switch (seq[0]) {
		case BACKSPACE:
			return EscapeSequence::ALT_BACKSPACE;
		case ESC:
			return EscapeSequence::ESCAPE;
		case '<':
			return EscapeSequence::ALT_LEFT_ARROW;
		case '>':
			return EscapeSequence::ALT_RIGHT_ARROW;
		case '\\':
			return EscapeSequence::ALT_BACKSLASH;
		default:
			Linenoise::Log("unrecognized escape sequence of length 1 - %d\n", seq[0]);
			break;
		}
		break;
	case 2:
		if (seq[0] == 'O') {
			switch (seq[1]) {
			case 'A': /* Up */
				return EscapeSequence::UP;
			case 'B': /* Down */
				return EscapeSequence::DOWN;
			case 'C': /* Right */
				return EscapeSequence::RIGHT;
			case 'D': /* Left */
				return EscapeSequence::LEFT;
			case 'H': /* Home */
				return EscapeSequence::HOME;
			case 'F': /* End*/
				return EscapeSequence::END;
			case 'c':
				return EscapeSequence::ALT_F;
			case 'd':
				return EscapeSequence::ALT_B;
			default:
				Linenoise::Log("unrecognized escape sequence (O) %d\n", seq[1]);
				break;
			}
		} else if (seq[0] == '[') {
			switch (seq[1]) {
			case 'A': /* Up */
				return EscapeSequence::UP;
			case 'B': /* Down */
				return EscapeSequence::DOWN;
			case 'C': /* Right */
				return EscapeSequence::RIGHT;
			case 'D': /* Left */
				return EscapeSequence::LEFT;
			case 'H': /* Home */
				return EscapeSequence::HOME;
			case 'F': /* End*/
				return EscapeSequence::END;
			case 'Z': /* Shift Tab */
				return EscapeSequence::SHIFT_TAB;
			default:
				Linenoise::Log("unrecognized escape sequence (seq[1]) %d\n", seq[1]);
				break;
			}
		} else {
			Linenoise::Log("unrecognized escape sequence of length %d (%d %d)\n", length, seq[0], seq[1]);
		}
		break;
	case 3:
		if (seq[2] == '~') {
			switch (seq[1]) {
			case '1':
				return EscapeSequence::HOME;
			case '3': /* Delete key. */
				return EscapeSequence::DELETE;
			case '4':
			case '8':
				return EscapeSequence::END;
			default:
				Linenoise::Log("unrecognized escape sequence (~) %d\n", seq[1]);
				break;
			}
		} else if (seq[1] == '5' && seq[2] == 'C') {
			return EscapeSequence::ALT_F;
		} else if (seq[1] == '5' && seq[2] == 'D') {
			return EscapeSequence::ALT_B;
		} else {
			Linenoise::Log("unrecognized escape sequence of length %d\n", length);
		}
		break;
	case 5:
		if (memcmp(seq, "[1;5C", 5) == 0 || memcmp(seq, "[1;3C", 5) == 0) {
			// [1;5C: move word right
			return EscapeSequence::CTRL_MOVE_FORWARDS;
		} else if (memcmp(seq, "[1;5D", 5) == 0 || memcmp(seq, "[1;3D", 5) == 0) {
			// [1;5D: move word left
			return EscapeSequence::CTRL_MOVE_BACKWARDS;
		} else {
			Linenoise::Log("unrecognized escape sequence (;) %d\n", seq[1]);
		}
		break;
	default:
		Linenoise::Log("unrecognized escape sequence of length %d\n", length);
		break;
	}
	return EscapeSequence::UNKNOWN;
}